

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

value_type __thiscall
andres::
BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
::operator()(BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
             *this,int it)

{
  reference piVar1;
  reference pfVar2;
  int local_20;
  int local_1c;
  
  local_20 = it;
  piVar1 = marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>
                     (*(View<int,_false,_std::allocator<unsigned_long>_> **)this,&local_20);
  local_1c = it;
  pfVar2 = marray_detail::AccessOperatorHelper<true>::
           execute<float,int,false,std::allocator<unsigned_long>>
                     (*(View<float,_false,_std::allocator<unsigned_long>_> **)(this + 8),&local_1c);
  return (float)*piVar1 + *pfVar2;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }